

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

uint __thiscall cppcms::crypto::hmac::digest_size(hmac *this)

{
  uint uVar1;
  pointer pmVar2;
  undefined8 uVar3;
  string *in_RDI;
  unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  *in_stack_ffffffffffffffb0;
  allocator *paVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [40];
  
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::get(in_stack_ffffffffffffffb0);
  if (pmVar2 == (pointer)0x0) {
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Hmac can be used only once",paVar4);
    booster::runtime_error::runtime_error
              ((runtime_error *)CONCAT44(in_stack_ffffffffffffffc4,uVar5),in_RDI);
    __cxa_throw(uVar3,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453d02);
  uVar1 = (*pmVar2->_vptr_message_digest[2])();
  return uVar1;
}

Assistant:

unsigned hmac::digest_size() const
	{
		if(!md_.get()){
			throw booster::runtime_error("Hmac can be used only once");
		}
		return md_->digest_size();
	}